

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::evaluateCollocationConstraintJacobian
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *pcVar6;
  element_type *peVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  reference pvVar11;
  const_reference pvVar12;
  element_type *this_00;
  element_type *peVar13;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *in_RCX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *in_R8;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  uint nu;
  uint nx;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffff868;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff870;
  size_type in_stack_fffffffffffff888;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
  *in_stack_fffffffffffff890;
  MatrixDynSize *in_stack_fffffffffffff898;
  StorageBaseType *in_stack_fffffffffffff8b0;
  ostringstream *this_01;
  double *in_stack_fffffffffffff8b8;
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_40;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_38;
  double local_30;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_28;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  double local_18;
  byte local_1;
  
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_XMM1_Qa;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (!bVar1) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38e939);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraint","Dynamical system not set.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                    (local_20);
  if (sVar4 != 2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    std::operator<<((ostream *)local_1b8,
                    "The size of the matrix containing the collocation point does not match the expected one. Input = "
                   );
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1b8,sVar4);
    std::operator<<(poVar5,", Expected = 2.");
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38e9e5);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraintJacobian",pcVar6);
    std::__cxx11::string::~string(local_1e8);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    goto LAB_0038f3f2;
  }
  sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                    (local_28);
  if (sVar4 != 2) {
    this_01 = local_360;
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,
                    "The size of the matrix containing the control inputs does not match the expected one. Input = "
                   );
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_28);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_360,sVar4);
    std::operator<<(poVar5,", Expected = 2.");
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38eb26);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"evaluateCollocationConstraintJacobian",pcVar6);
    std::__cxx11::string::~string(local_380);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_360);
    goto LAB_0038f3f2;
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38ebf4);
  sVar8 = DynamicalSystem::stateSpaceSize(peVar7);
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38ec11);
  sVar9 = DynamicalSystem::controlSpaceSize(peVar7);
  sVar4 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::size
                    (local_38);
  if (sVar4 != 2) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  }
  sVar4 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::size
                    (local_40);
  if (sVar4 != 2) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
              (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  }
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,0);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_38,0);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar8 & 0xffffffff)) goto LAB_0038ecb4;
  }
  else {
LAB_0038ecb4:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_38,0);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38eced);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_28,0);
  uVar2 = (*peVar7->_vptr_DynamicalSystem[3])(peVar7,pvVar12);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38ed23);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while setting the control input.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  this_00 = std::
            __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x38ed5c);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,0);
  uVar2 = (*this_00->_vptr_DynamicalSystem[9])(local_18,this_00,pvVar12,in_RDI + 0xc0);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38eda7);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system jacobian.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  toEigen(in_stack_fffffffffffff898);
  toEigen(in_stack_fffffffffffff898);
  Eigen::operator*(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::operator+
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff898,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)peVar7);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,0);
  toEigen(in_stack_fffffffffffff898);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffff870,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
              *)in_stack_fffffffffffff868);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,0);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_40,0);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar9 & 0xffffffff)) goto LAB_0038eedc;
  }
  else {
LAB_0038eedc:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_40,0);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar13 = std::
            __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x38ef15);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,0);
  uVar2 = (*peVar13->_vptr_DynamicalSystem[10])(local_18,peVar13,pvVar12,in_RDI + 0xe8);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38ef60);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system control jacobian.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  toEigen(in_stack_fffffffffffff898);
  Eigen::operator*(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,0);
  toEigen(in_stack_fffffffffffff898);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffff870,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_stack_fffffffffffff868);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,1);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_38,1);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar8 & 0xffffffff)) goto LAB_0038f061;
  }
  else {
LAB_0038f061:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_38,1);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar13 = std::
            __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x38f09b);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_28,1);
  uVar2 = (*peVar13->_vptr_DynamicalSystem[3])(peVar13,pvVar12);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f0d2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while setting the control input.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  peVar13 = std::
            __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x38f10b);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,1);
  uVar2 = (*peVar13->_vptr_DynamicalSystem[9])(local_18 + local_30,peVar13,pvVar12,in_RDI + 0xc0);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f160);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system jacobian.");
    local_1 = 0;
    goto LAB_0038f3f2;
  }
  toEigen(in_stack_fffffffffffff898);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator-((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)this_00);
  toEigen(in_stack_fffffffffffff898);
  Eigen::operator*(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>const>>
  ::operator+((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffff898,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)peVar7);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_38,1);
  toEigen(in_stack_fffffffffffff898);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)peVar13,
             in_stack_fffffffffffff868);
  std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
            (local_40,1);
  uVar10 = iDynTree::MatrixDynSize::rows();
  if (uVar10 == (sVar8 & 0xffffffff)) {
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_40,1);
    uVar10 = iDynTree::MatrixDynSize::cols();
    if (uVar10 != (sVar9 & 0xffffffff)) goto LAB_0038f2ad;
  }
  else {
LAB_0038f2ad:
    pvVar11 = std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::
              operator[](local_40,1);
    iDynTree::MatrixDynSize::resize((ulong)pvVar11,sVar8 & 0xffffffff);
  }
  peVar7 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38f2e7);
  pvVar12 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
            operator[](local_20,1);
  uVar2 = (*peVar7->_vptr_DynamicalSystem[10])(local_18 + local_30,peVar7,pvVar12,in_RDI + 0xe8);
  if ((uVar2 & 1) == 0) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f33a);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintJacobian",
               "Error while evaluating the dynamical system control jacobian.");
    local_1 = 0;
  }
  else {
    toEigen(in_stack_fffffffffffff898);
    Eigen::operator*(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              (local_40,1);
    toEigen(in_stack_fffffffffffff898);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)peVar13,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)peVar7);
    local_1 = 1;
  }
LAB_0038f3f2:
  return (bool)(local_1 & 1);
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                            const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                            std::vector<MatrixDynSize> &stateJacobianValues,
                                                                            std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }


                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT/2.0*toEigen(m_controlJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[1], time+dT, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[1], time + dT, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[1]) = dT/2.0*toEigen(m_controlJacBuffer);

                return true;

            }